

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic_l3_fs.c
# Opt level: O0

int picnic_l3_fs_read_private_key(picnic_l3_fs_privatekey_t *key,uint8_t *buf,size_t buflen)

{
  picnic_instance_t *ppVar1;
  ulong in_RDX;
  char *in_RSI;
  void *in_RDI;
  picnic_instance_t *instance;
  picnic_params_t param;
  int local_4;
  
  if (((in_RDI == (void *)0x0) || (in_RSI == (char *)0x0)) || (in_RDX == 0)) {
    local_4 = -1;
  }
  else if (*in_RSI == '\x03') {
    ppVar1 = picnic_instance_get(Picnic_L3_FS);
    if (ppVar1 == (picnic_instance_t *)0x0) {
      local_4 = -1;
    }
    else if (in_RDX < 0x49) {
      local_4 = -1;
    }
    else {
      memcpy(in_RDI,in_RSI + 1,0x48);
      local_4 = 0;
    }
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int PICNIC_CALLING_CONVENTION picnic_l3_fs_read_private_key(picnic_l3_fs_privatekey_t* key,
                                                            const uint8_t* buf, size_t buflen) {
  if (!key || !buf || buflen < 1) {
    return -1;
  }

  const picnic_params_t param = buf[0];
  if (param != PARAM) {
    return -1;
  }

  const picnic_instance_t* instance = picnic_instance_get(PARAM);
  if (!instance) {
    return -1;
  }

  if (buflen < PRIVATE_KEY_SIZE) {
    return -1;
  }

#if (LOWMC_BLOCK_BITS & 0x7) != 0
  static const unsigned int diff = LOWMC_BLOCK_SZ * 8 - LOWMC_BLOCK_BITS;
  /* sanity check of public data: padding bits need to be 0 */
  const int check = check_padding_bits(buf[1 + LOWMC_BLOCK_SZ - 1], diff) |
                    check_padding_bits(buf[1 + 2 * LOWMC_BLOCK_SZ - 1], diff) |
                    check_padding_bits(buf[1 + 3 * LOWMC_BLOCK_SZ - 1], diff);
  picnic_declassify(&check, sizeof(check));
  if (check) {
    return -1;
  }
#endif

  memcpy(key->data, buf + 1, PRIVATE_KEY_SIZE - 1);
  return 0;
}